

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

int32_t __thiscall
icu_63::PluralAvailableLocalesEnumeration::count
          (PluralAvailableLocalesEnumeration *this,UErrorCode *status)

{
  UErrorCode UVar1;
  int32_t iVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = *(UErrorCode *)&(this->super_StringEnumeration).field_0x74;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = ures_getSize_63(this->fLocales);
      return iVar2;
    }
    *status = UVar1;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }